

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall stackjit::ExecutionEngine::loadRuntimeLibrary(ExecutionEngine *this)

{
  pointer pcVar1;
  bool bVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_38;
  
  if ((this->mVMState->config).loadRuntimeLibrary == true) {
    pcVar1 = (this->mBaseDir)._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->mBaseDir)._M_string_length);
    std::__cxx11::string::append((char *)&local_38);
    bVar2 = loadAssembly(this,&local_38,Library);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Could not load the runtime library.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void ExecutionEngine::loadRuntimeLibrary() {
		if (mVMState.config.loadRuntimeLibrary) {
			bool loaded = loadAssembly(mBaseDir + "rtlib/rtlib.simg");

			if (!loaded) {
				throw std::runtime_error("Could not load the runtime library.");
			}
		}
	}